

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O2

bool __thiscall pgn::find_move<(Piece)4>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  U8 UVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  Move *m_00;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  Movegen::generate<(Movetype)14,(Piece)4>(&local_3a8);
  UVar1 = m->type;
  m_00 = local_3a8.list;
  lVar5 = 0;
  do {
    lVar6 = (long)local_3a8.last;
    if (lVar6 <= lVar5) {
LAB_0011b268:
      Movegen::~Movegen(&local_3a8);
      return lVar5 < lVar6;
    }
    bVar3 = position::is_legal(p,m_00);
    if (bVar3) {
      if (UVar1 == '\x11') {
        bVar2 = m_00->t;
        if (*to == (uint)bVar2) {
          if (((row < 0) || (bVar4 = m_00->f, (uint)(bVar4 >> 3) != row)) &&
             ((col < 0 || (bVar4 = m_00->f, (bVar4 & 7) != col)))) {
            if (-1 < (col & row)) goto LAB_0011b229;
            m->f = m_00->f;
          }
          else {
            m->f = bVar4;
          }
          m->t = bVar2;
          m->type = m_00->type;
          goto LAB_0011b268;
        }
      }
      else if ((m->type == m_00->type) && (bVar2 = m_00->t, *to == (uint)bVar2)) {
        if (((row < 0) || (bVar4 = m_00->f, (uint)(bVar4 >> 3) != row)) &&
           ((col < 0 || (bVar4 = m_00->f, (bVar4 & 7) != col)))) {
          if (-1 < (col & row)) goto LAB_0011b229;
          m->f = m_00->f;
        }
        else {
          m->f = bVar4;
        }
        m->t = bVar2;
        goto LAB_0011b268;
      }
    }
LAB_0011b229:
    lVar5 = lVar5 + 1;
    m_00 = m_00 + 1;
  } while( true );
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}